

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  PHYSFS_Io *pPVar9;
  FileHandle *pFVar10;
  void **retval;
  long *plVar11;
  PHYSFS_ErrorCode errcode;
  char *dst;
  __PHYSFS_DIRHANDLE__ *h;
  long lStack_48;
  char *local_40;
  char *arcfname;
  
  plVar11 = &lStack_48;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    if (searchPath == (DirHandle *)0x0) {
      errcode = PHYSFS_ERR_NOT_FOUND;
    }
    else {
      sVar6 = strlen(_fname);
      if (sVar6 + longest_root + 2 < 0x100) {
        plVar7 = (long *)((long)&lStack_48 - (longest_root + sVar6 + 0x19 & 0xfffffffffffffff0));
        lVar8 = 0;
        plVar11 = plVar7;
LAB_001097b4:
        *plVar7 = lVar8;
        dst = (char *)((long)plVar7 + longest_root + 9);
        plVar11[-1] = 0x1097ca;
        iVar5 = sanitizePlatformIndependentPath(_fname,dst);
        if (searchPath == (DirHandle *)0x0 || iVar5 == 0) {
          pFVar10 = (FileHandle *)0x0;
        }
        else {
          pFVar10 = (FileHandle *)0x0;
          h = searchPath;
          arcfname = (char *)plVar7;
          do {
            local_40 = dst;
            plVar11[-1] = 0x109804;
            iVar5 = verifyPath(h,&local_40,0);
            pcVar4 = local_40;
            if (iVar5 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->openRead;
              plVar11[-1] = 0x109816;
              pPVar9 = (*p_Var2)(pvVar1,pcVar4);
              if (pPVar9 != (PHYSFS_Io *)0x0) {
                plVar11[-1] = 0x10984f;
                pFVar10 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
                if (pFVar10 == (FileHandle *)0x0) {
                  p_Var3 = pPVar9->destroy;
                  plVar11[-1] = 0x10988b;
                  (*p_Var3)(pPVar9);
                  plVar11[-1] = 0x109895;
                  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                  pFVar10 = (FileHandle *)0x0;
                  plVar7 = (long *)arcfname;
                }
                else {
                  *(undefined8 *)&pFVar10->forReading = 0;
                  pFVar10->dirHandle = (DirHandle *)0x0;
                  pFVar10->buffill = 0;
                  pFVar10->bufpos = 0;
                  pFVar10->buffer = (PHYSFS_uint8 *)0x0;
                  pFVar10->bufsize = 0;
                  pFVar10->io = pPVar9;
                  pFVar10->forReading = '\x01';
                  pFVar10->dirHandle = h;
                  pFVar10->next = openReadList;
                  plVar7 = (long *)arcfname;
                  openReadList = pFVar10;
                }
                break;
              }
            }
            h = h->next;
            plVar7 = (long *)arcfname;
          } while (h != (__PHYSFS_DIRHANDLE__ *)0x0);
        }
        plVar11[-1] = 0x1098a8;
        __PHYSFS_platformReleaseMutex(stateLock);
        if (*plVar7 == 0) {
          return (PHYSFS_File *)pFVar10;
        }
        plVar11[-1] = 0x1098b7;
        (*__PHYSFS_AllocatorHooks.Free)(plVar7);
        return (PHYSFS_File *)pFVar10;
      }
      plVar7 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar6 + 10);
      if (plVar7 != (long *)0x0) {
        lVar8 = 1;
        goto LAB_001097b4;
      }
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    PHYSFS_setErrorCode(errcode);
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (PHYSFS_File *)0x0;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 2;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root + 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */
            else
            {
                memset(fh, '\0', sizeof (FileHandle));
                fh->io = io;
                fh->forReading = 1;
                fh->dirHandle = i;
                fh->next = openReadList;
                openReadList = fh;
            } /* else */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}